

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

Flag<TestConfig> *
anon_unknown.dwarf_41275::CredentialFlag
          (Flag<TestConfig> *__return_storage_ptr__,Flag<CredentialConfig> *flag)

{
  Flag<CredentialConfig> *this;
  Flag<CredentialConfig> FStack_48;
  
  __return_storage_ptr__->name = flag->name;
  __return_storage_ptr__->has_param = flag->has_param;
  __return_storage_ptr__->skip_handshaker = false;
  Flag<CredentialConfig>::Flag(&FStack_48,flag);
  (__return_storage_ptr__->set_param).super__Function_base._M_manager = (_Manager_type)0x0;
  (__return_storage_ptr__->set_param)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->set_param).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->set_param).super__Function_base._M_functor + 8) =
       0;
  this = (Flag<CredentialConfig> *)operator_new(0x30);
  Flag<CredentialConfig>::Flag(this,&FStack_48);
  *(Flag<CredentialConfig> **)&(__return_storage_ptr__->set_param).super__Function_base._M_functor =
       this;
  (__return_storage_ptr__->set_param)._M_invoker =
       std::
       _Function_handler<bool_(TestConfig_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/test_config.cc:289:27)>
       ::_M_invoke;
  (__return_storage_ptr__->set_param).super__Function_base._M_manager =
       std::
       _Function_handler<bool_(TestConfig_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/test_config.cc:289:27)>
       ::_M_manager;
  std::_Function_base::~_Function_base(&FStack_48.set_param.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

Flag<TestConfig> CredentialFlag(Flag<CredentialConfig> flag) {
  return Flag<TestConfig>{flag.name, flag.has_param, /*skip_handshaker=*/false,
                          [=](TestConfig *config, const char *param) -> bool {
                            if (config->credentials.empty()) {
                              fprintf(stderr, "No credentials configured.\n");
                              return false;
                            }
                            return flag.set_param(&config->credentials.back(),
                                                  param);
                          }};
}